

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O0

void __thiscall
lf::io::VtkWriter::WriteScalarPointData<float>
          (VtkWriter *this,string *name,MeshDataSet<float> *mds,float undefined_value)

{
  value_type vVar1;
  float fVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  element_type *peVar7;
  element_type *peVar8;
  undefined4 extraout_var;
  reference ppEVar9;
  value_type *pvVar10;
  reference pvVar11;
  value_type local_398;
  Entity *local_338;
  Entity *p;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  ScalarData<float> data;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  float local_24;
  MeshDataSet<float> *pMStack_20;
  float undefined_value_local;
  MeshDataSet<float> *mds_local;
  string *name_local;
  VtkWriter *this_local;
  
  local_24 = undefined_value;
  pMStack_20 = mds;
  mds_local = (MeshDataSet<float> *)name;
  name_local = (string *)this;
  if (this->order_ != '\x01') {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,
                    "WritePointData accepts MeshDataSets only if order = 1. For order > 1 you have to provide MeshFunctions."
                   );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"order_ == 1",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e0,&local_208,0x3c1,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
               ,&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_2a1);
    lf::base::AssertionFailed(&local_250,&local_278,0x3c1,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    abort();
  }
  CheckAttributeSetName<std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>>
            (this,&(this->vtk_file_).point_data,name);
  data.lookup_table._M_dataplus._M_p = (pointer)0x0;
  data.lookup_table._M_string_length = 0;
  data.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  data.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.name.field_2._8_8_ = 0;
  data.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  data.name._M_string_length = 0;
  data.name.field_2._M_allocated_capacity = 0;
  __range2 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)0x0;
  data.name._M_dataplus._M_p = (pointer)0x0;
  data.lookup_table.field_2._M_allocated_capacity = 0;
  VtkFile::ScalarData<float>::ScalarData((ScalarData<float> *)&__range2);
  peVar7 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar8 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  uVar5 = (**peVar8->_vptr_Mesh)();
  uVar5 = (*peVar7->_vptr_Mesh[3])(peVar7,(ulong)uVar5);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)((long)&data.name.field_2 + 8),(ulong)uVar5);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mds_local);
  peVar7 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar8 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  uVar5 = (**peVar8->_vptr_Mesh)();
  iVar6 = (*peVar7->_vptr_Mesh[2])(peVar7,(ulong)uVar5);
  __begin2._M_current = (Entity **)CONCAT44(extraout_var,iVar6);
  __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  p = (Entity *)
      std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&p);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    ppEVar9 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end2);
    local_338 = *ppEVar9;
    bVar4 = (**(code **)(*(long *)pMStack_20 + 8))(pMStack_20,local_338);
    fVar2 = local_24;
    if ((bVar4 & 1) == 0) {
      peVar7 = std::
               __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      uVar5 = (*peVar7->_vptr_Mesh[5])(peVar7,local_338);
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)((long)&data.name.field_2 + 8),
                           (ulong)uVar5);
      *pvVar11 = fVar2;
    }
    else {
      pvVar10 = (value_type *)(*(code *)**(undefined8 **)pMStack_20)(pMStack_20,local_338);
      vVar1 = *pvVar10;
      peVar7 = std::
               __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      uVar5 = (*peVar7->_vptr_Mesh[5])(peVar7,local_338);
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)((long)&data.name.field_2 + 8),
                           (ulong)uVar5);
      *pvVar11 = vVar1;
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2);
  }
  boost::
  variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>
  ::variant<lf::io::VtkFile::ScalarData<float>>
            ((variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>
              *)&local_398,(ScalarData<float> *)&__range2,true);
  std::
  vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
  ::push_back(&(this->vtk_file_).point_data,&local_398);
  boost::
  variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
  ::~variant(&local_398);
  VtkFile::ScalarData<float>::~ScalarData((ScalarData<float> *)&__range2);
  return;
}

Assistant:

void VtkWriter::WriteScalarPointData(const std::string& name,
                                     const mesh::utils::MeshDataSet<T>& mds,
                                     T undefined_value) {
  LF_ASSERT_MSG(order_ == 1,
                "WritePointData accepts MeshDataSets only if order = 1. For "
                "order > 1 you have to provide MeshFunctions.");
  CheckAttributeSetName(vtk_file_.point_data, name);
  VtkFile::ScalarData<T> data{};
  data.data.resize(mesh_->NumEntities(mesh_->DimMesh()));
  data.name = name;
  for (const auto* p : mesh_->Entities(mesh_->DimMesh())) {
    if (mds.DefinedOn(*p)) {
      data.data[mesh_->Index(*p)] = mds(*p);
    } else {
      data.data[mesh_->Index(*p)] = undefined_value;
    }
  }
  vtk_file_.point_data.push_back(std::move(data));
}